

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

http_protocol_version_t find_http_protocol_version(char *sval)

{
  int iVar1;
  http_protocol_version_t hVar2;
  http_protocol_version_t hVar3;
  char **ppcVar4;
  
  hVar3 = HTTP10;
  ppcVar4 = http_protocol_version;
  while ((hVar2 = INVALID_PROTO, *ppcVar4 != (char *)0x0 &&
         (iVar1 = strncmp(sval,*ppcVar4,0x10), hVar2 = hVar3, iVar1 != 0))) {
    hVar3 = hVar3 + HTTP11;
    ppcVar4 = ppcVar4 + 1;
  }
  return hVar2;
}

Assistant:

http_protocol_version_t find_http_protocol_version(const char *sval)
{
  http_protocol_version_t result = HTTP10; /* value corresponding to etable[0] */
  int i = 0;
  for (i = 0; http_protocol_version[i] != NULL; ++i, ++result)
    if (!(strncmp(sval, http_protocol_version[i], 16)))
      return result;
  return INVALID_PROTO;
}